

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# difference_iterator.hpp
# Opt level: O0

difference_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::greater<void>_>
* __thiscall
burst::
make_difference_iterator<std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,std::greater<void>>
          (difference_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::greater<void>_>
           *__return_storage_ptr__,burst *this,vector<int,_std::allocator<int>_> *minuend)

{
  const_iterator cVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  vector<int,_std::allocator<int>_> *subtrahend_local;
  vector<int,_std::allocator<int>_> *minuend_local;
  
  cVar1 = std::begin<std::vector<int,std::allocator<int>>>
                    ((vector<int,_std::allocator<int>_> *)this);
  cVar2 = std::end<std::vector<int,std::allocator<int>>>((vector<int,_std::allocator<int>_> *)this);
  cVar3 = std::begin<std::vector<int,std::allocator<int>>>(minuend);
  cVar4 = std::end<std::vector<int,std::allocator<int>>>(minuend);
  make_difference_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::greater<void>>
            (__return_storage_ptr__,(burst *)cVar1._M_current,cVar2._M_current,cVar3._M_current,
             cVar4._M_current);
  return __return_storage_ptr__;
}

Assistant:

auto
        make_difference_iterator
        (
            ForwardRange1 && minuend,
            ForwardRange2 && subtrahend,
            Compare compare
        )
    {
        using std::begin;
        using std::end;
        return
            make_difference_iterator
            (
                begin(std::forward<ForwardRange1>(minuend)),
                end(std::forward<ForwardRange1>(minuend)),
                begin(std::forward<ForwardRange2>(subtrahend)),
                end(std::forward<ForwardRange2>(subtrahend)),
                compare
            );
    }